

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

Vec_Int_t * Vec_IntStart(int nSize)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__s;
  
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar1 << 2);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = nSize;
  memset(__s,0,(long)nSize << 2);
  return pVVar2;
}

Assistant:

static inline Vec_Int_t * Vec_IntAlloc( int nCap )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    return p;
}